

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  ExprList *this_00;
  pointer ppMVar1;
  pointer ppMVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  Result RVar5;
  Result RVar6;
  reference pvVar7;
  uint64_t uVar8;
  pointer *__ptr;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar9;
  undefined1 local_138 [8];
  undefined1 local_130 [8];
  undefined1 local_128 [16];
  anon_union_16_2_ecfd7102_for_Location_1 aStack_118;
  _Head_base<0UL,_wabt::MemoryImport_*,_false> local_108;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::MemoryImport_*,_false> local_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  string name;
  Location loc;
  ModuleFieldList export_fields;
  Const local_80;
  
  RVar5 = Expect(this,Lpar);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar5 = Expect(this,Memory);
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  RVar6 = ParseInlineExports(this,&export_fields,Memory);
  RVar5.enum_ = Error;
  if (RVar6.enum_ == Error) goto LAB_00130ca5;
  bVar4 = PeekMatchLpar(this,Import);
  if (bVar4) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::MemoryImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    *(undefined4 *)(local_128._0_8_ + 0x88) = 0x10000;
    RVar6 = ParseInlineImport(this,(Import *)local_128._0_8_);
    aVar9.offset = local_128._0_8_;
    if ((((RVar6.enum_ != Error) &&
         (RVar6 = ParseLimitsIndex(this,(Limits *)(local_128._0_8_ + 0x70)),
         aVar9.offset = local_128._0_8_, RVar6.enum_ != Error)) &&
        (RVar6 = ParseLimits(this,(Limits *)(local_128._0_8_ + 0x70)),
        aVar9.offset = local_128._0_8_, RVar6.enum_ != Error)) &&
       (RVar6 = ParsePageSize(this,(uint32_t *)
                                   &((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)(local_128._0_8_ + 0x88))->_M_allocated_capacity),
       aVar9.offset = local_128._0_8_, RVar6.enum_ != Error)) {
      GetLocation(&local_80.loc,this);
      std::
      make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
                ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                 local_138,(Location *)local_128);
      local_e0 = local_138;
      local_138 = (undefined1  [8])0x0;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)local_e0);
      if (local_e0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_e0 + 8))();
      }
      local_e0 = (undefined1  [8])0x0;
      aVar9.offset = local_128._0_8_;
      if ((_Tuple_impl<0UL,_wabt::MemoryImport_*,_std::default_delete<wabt::MemoryImport>_>)
          local_138 != (MemoryImport *)0x0) {
        (**(code **)(*(long *)local_138 + 8))();
        aVar9.offset = local_128._0_8_;
      }
      goto LAB_00130fef;
    }
  }
  else {
    std::make_unique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
              ((Location *)local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc);
    *(undefined4 *)&(((string *)((long)local_138 + 0x78))->_M_dataplus)._M_p = 0x10000;
    RVar6 = ParseLimitsIndex(this,(Limits *)((long)local_138 + 0x60));
    RVar5.enum_ = Error;
    aVar9.offset = (size_t)local_138;
    if (RVar6.enum_ != Error) {
      bVar4 = PeekMatchLpar(this,PageSize);
      if (bVar4) {
        RVar6 = ParsePageSize(this,(uint32_t *)
                                   &(((Memory *)((long)local_138 + 0x50))->page_limits).max);
        aVar9.offset = (size_t)local_138;
        if (RVar6.enum_ != Error) {
          bVar4 = PeekMatchLpar(this,Data);
          if (bVar4) goto LAB_00130d07;
          ConsumeIfLpar(this);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"inline data segment",(allocator<char> *)local_130);
          local_128._0_8_ = 0;
          local_128._8_4_ = 0;
          local_128._12_4_ = 0;
          aStack_118.field_0.line = 0;
          aStack_118.field_0.first_column = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_initialize<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_128,
                     &local_80,&local_80.type_);
          RVar5 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_128,(char *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128);
          std::__cxx11::string::_M_dispose();
          aVar9.offset = (size_t)local_138;
        }
      }
      else {
LAB_00130d07:
        bVar4 = MatchLpar(this,Data);
        if (bVar4) {
          std::make_unique<wabt::DataSegmentModuleField,wabt::Location&>((Location *)local_130);
          auVar3 = local_130;
          ppMVar1 = (module->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppMVar2 = (module->memories).
                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          GetLocation((Location *)local_128,this);
          Var::Var((Var *)&local_80,(Index)((ulong)((long)ppMVar1 - (long)ppMVar2) >> 3),
                   (Location *)local_128);
          Var::operator=(&((DataSegment *)((long)auVar3 + 0x40))->memory_var,(Var *)&local_80);
          Var::~Var((Var *)&local_80);
          this_00 = &((DataSegment *)((long)auVar3 + 0x40))->offset;
          if (*(undefined1 *)((long)local_138 + 0x72) == '\x01') {
            aStack_118.field_0.line = 0;
            aStack_118.field_0.first_column = 0;
            aStack_118.field_0.last_column = 0;
            local_128._0_8_ = 0;
            local_128._8_4_ = 0;
            local_128._12_4_ = 0;
            Const::I64(&local_80,0,(Location *)local_128);
          }
          else {
            aStack_118.field_0.line = 0;
            aStack_118.field_0.first_column = 0;
            aStack_118.field_0.last_column = 0;
            local_128._0_8_ = 0;
            local_128._8_4_ = 0;
            local_128._12_4_ = 0;
            Const::I32(&local_80,0,(Location *)local_128);
          }
          std::make_unique<wabt::ConstExpr,wabt::Const>((Const *)local_f0);
          local_f0._8_8_ = local_f0._0_8_;
          local_f0._0_8_ = (long *)0x0;
          intrusive_list<wabt::Expr>::push_back
                    (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                             (local_f0 + 8));
          if ((long *)local_f0._8_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_f0._8_8_ + 8))();
          }
          local_f0._8_8_ = (char *)0x0;
          if ((long *)local_f0._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_f0._0_8_ + 8))();
          }
          pvVar7 = intrusive_list<wabt::Expr>::back(this_00);
          (pvVar7->loc).filename._M_len = loc.filename._M_len;
          (pvVar7->loc).filename._M_str = loc.filename._M_str;
          (pvVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
          *(undefined8 *)((long)&(pvVar7->loc).field_1 + 8) = loc.field_1._8_8_;
          ParseTextListOpt(this,&((DataSegment *)((long)auVar3 + 0x40))->data);
          RVar6 = Expect(this,Rpar);
          if (RVar6.enum_ != Error) {
            uVar8 = WABT_BYTES_TO_MIN_PAGES
                              ((long)(((DataSegment *)((long)auVar3 + 0x40))->data).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(((DataSegment *)((long)auVar3 + 0x40))->data).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                               *(uint32_t *)
                                &(((string *)((long)local_138 + 0x78))->_M_dataplus)._M_p);
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_138 + 0x60))->_M_allocated_capacity = uVar8 & 0xffffffff;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_138 + 0x68))->_M_allocated_capacity = uVar8 & 0xffffffff;
            *(undefined1 *)&((Limits *)((long)local_138 + 0x70))->initial = 1;
            local_f8._M_head_impl = (MemoryImport *)local_138;
            local_138 = (undefined1  [8])0x0;
            Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                        *)&local_f8);
            if (local_f8._M_head_impl != (MemoryImport *)0x0) {
              (*((local_f8._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.
                _vptr_Import[1])();
            }
            local_f8._M_head_impl = (MemoryImport *)0x0;
            local_100._M_head_impl = (DataSegmentModuleField *)local_130;
            local_130 = (undefined1  [8])0x0;
            Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                        *)&local_100);
            if (local_100._M_head_impl != (DataSegmentModuleField *)0x0) {
              (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_100._M_head_impl = (DataSegmentModuleField *)0x0;
          }
          if (local_130 != (undefined1  [8])0x0) {
            (*(((ModuleFieldMixin<(wabt::ModuleFieldType)8> *)local_130)->super_ModuleField).
              _vptr_ModuleField[1])();
          }
          aVar9.offset = (size_t)local_138;
          if (RVar6.enum_ != Error) {
LAB_00130fef:
            if ((Import *)aVar9.offset != (Import *)0x0) {
              (**(code **)(*(long *)aVar9.offset + 8))();
            }
            anon_unknown_1::AppendInlineExportFields
                      (module,&export_fields,
                       (int)((ulong)((long)(module->memories).
                                           super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(module->memories).
                                          super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
            RVar5 = Expect(this,Rpar);
            RVar5.enum_ = (Enum)(RVar5.enum_ == Error);
            goto LAB_00130ca5;
          }
        }
        else {
          RVar6 = ParseLimits(this,(Limits *)&(((Memory *)((long)local_138 + 0x50))->name).field_2);
          aVar9.offset = (size_t)local_138;
          if ((RVar6.enum_ != Error) &&
             (RVar6 = ParsePageSize(this,(uint32_t *)((long)local_138 + 0x78)),
             aVar9.offset = (size_t)local_138, RVar6.enum_ != Error)) {
            local_108._M_head_impl = (MemoryImport *)local_138;
            local_138 = (undefined1  [8])0x0;
            Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                        *)&local_108);
            if (local_108._M_head_impl != (MemoryImport *)0x0) {
              (*((local_108._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)2>).super_Import.
                _vptr_Import[1])();
            }
            local_108._M_head_impl = (MemoryImport *)0x0;
            aVar9.offset = (size_t)local_138;
            goto LAB_00130fef;
          }
        }
      }
    }
  }
  if ((Import *)aVar9.offset != (Import *)0x0) {
    (**(code **)(*(long *)aVar9.offset + 8))();
  }
LAB_00130ca5:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)RVar5.enum_;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<MemoryImport>(name);
    import->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    CHECK_RESULT(ParsePageSize(&import->memory.page_size));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<MemoryModuleField>(loc, name);
    field->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
    CHECK_RESULT(ParseLimitsIndex(&field->memory.page_limits));
    if (PeekMatchLpar(TokenType::PageSize)) {
      // this is the data abbreviation (no limits)
      CHECK_RESULT(ParsePageSize(&field->memory.page_size));
      if (!PeekMatchLpar(TokenType::Data)) {
        ConsumeIfLpar();
        return ErrorExpected({"inline data segment"});
      }
    }
    if (MatchLpar(TokenType::Data)) {
      auto data_segment_field = std::make_unique<DataSegmentModuleField>(loc);
      DataSegment& data_segment = data_segment_field->data_segment;
      data_segment.memory_var = Var(module->memories.size(), GetLocation());
      data_segment.offset.push_back(std::make_unique<ConstExpr>(
          field->memory.page_limits.is_64 ? Const::I64(0) : Const::I32(0)));
      data_segment.offset.back().loc = loc;
      ParseTextListOpt(&data_segment.data);
      EXPECT(Rpar);

      uint32_t num_pages = WABT_BYTES_TO_MIN_PAGES(data_segment.data.size(),
                                                   field->memory.page_size);
      field->memory.page_limits.initial = num_pages;
      field->memory.page_limits.max = num_pages;
      field->memory.page_limits.has_max = true;

      module->AppendField(std::move(field));
      module->AppendField(std::move(data_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&field->memory.page_limits));
      CHECK_RESULT(ParsePageSize(&field->memory.page_size));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}